

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

leb_NodeAndNeighbors *
leb_DecodeNodeAndNeighbors
          (leb_NodeAndNeighbors *__return_storage_ptr__,leb_Heap *leb,uint32_t threadID)

{
  leb_SameDepthNeighborIDs nodeIDs_00;
  leb_Node node;
  leb_Node node_00;
  uint32_t uVar1;
  leb_SameDepthNeighborIDs lVar2;
  undefined8 local_50;
  leb_SameDepthNeighborIDs local_48;
  uint32_t b;
  uint32_t cmp;
  int local_28;
  undefined4 uStack_24;
  int32_t nodeDepth;
  leb_SameDepthNeighborIDs nodeIDs;
  uint32_t threadID_local;
  leb_Heap *leb_local;
  
  _uStack_24 = 0;
  nodeIDs.left = 0;
  nodeIDs.right = 1;
  local_28 = 0;
  nodeIDs.edge = threadID;
  while( true ) {
    node_00.depth = local_28;
    node_00.id = nodeIDs.right;
    uVar1 = leb__HeapRead(leb,node_00);
    if (uVar1 < 2) break;
    local_28 = local_28 + 1;
    node.depth = local_28;
    node.id = nodeIDs.right << 1;
    uVar1 = leb__HeapRead(leb,node);
    nodeIDs_00.edge = nodeIDs.left;
    nodeIDs_00._reserved = nodeIDs.right;
    nodeIDs_00.left = uStack_24;
    nodeIDs_00.right = nodeDepth;
    lVar2 = leb__SplitNodeIDs(nodeIDs_00,(uint)(uVar1 <= nodeIDs.edge));
    local_50 = lVar2._0_8_;
    _uStack_24 = local_50;
    local_48._0_8_ = lVar2._8_8_;
    nodeIDs.left = local_48.left;
    nodeIDs.right = local_48.right;
    nodeIDs.edge = nodeIDs.edge - uVar1 * (uVar1 <= nodeIDs.edge);
  }
  lVar2.edge = nodeIDs.left;
  lVar2._reserved = nodeIDs.right;
  lVar2.left = uStack_24;
  lVar2.right = nodeDepth;
  leb__NodeAndNeighborsFromSameDepthNeighborIDs(__return_storage_ptr__,leb,lVar2,local_28);
  return __return_storage_ptr__;
}

Assistant:

LEBDEF leb_NodeAndNeighbors
leb_DecodeNodeAndNeighbors(const leb_Heap *leb, uint32_t threadID)
{
#define nodeID nodeIDs._reserved
    leb_SameDepthNeighborIDs nodeIDs = {0u, 0u, 0u, 1u};
    int32_t nodeDepth = 0;

    while (leb__HeapRead(leb, {nodeID, nodeDepth}) > 1u) {
        uint32_t cmp = leb__HeapRead(leb, {nodeID << 1u, ++nodeDepth});
        uint32_t b = threadID < cmp ? 0u : 1u;

        nodeIDs = leb__SplitNodeIDs(nodeIDs, b);
        threadID-= cmp * b;
    }

    return leb__NodeAndNeighborsFromSameDepthNeighborIDs(leb, nodeIDs, nodeDepth);
#undef nodeID
}